

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_traits.c
# Opt level: O0

mpt_type_traits * mpt_type_traits(mpt_type_t type)

{
  int iVar1;
  mpt_named_traits *pmVar2;
  mpt_type_traits *local_68;
  mpt_type_traits *local_58;
  mpt_type_traits *local_50;
  mpt_type_traits *local_48;
  mpt_type_traits *local_40;
  mpt_named_traits *it_1;
  int pos;
  mpt_named_traits *it;
  generic_traits_chunk *group;
  mpt_type_t type_local;
  
  if (type == 0) {
    type_local = 0;
  }
  else if (type < 0x20) {
    if (core_types == (mpt_type_traits *)0x0) {
      _core_init();
    }
    if (core_types[type].size == 0) {
      local_40 = (mpt_type_traits *)0x0;
    }
    else {
      local_40 = core_types + type;
    }
    type_local = (mpt_type_t)local_40;
  }
  else if ((type < 0x60) || (0x7a < type)) {
    if ((type < 0x40) || (0x59 < type)) {
      if ((type < 0x80) || (0xbf < type)) {
        if ((type < 0xc0) || (0xff < type)) {
          switch(type) {
          case 0x800:
            type_local = (mpt_type_t)mpt_identifier_traits();
            break;
          case 0x801:
            type_local = (mpt_type_t)mpt_meta_reference_traits();
            break;
          case 0x802:
            type_local = (mpt_type_t)mpt_array_traits();
            break;
          case 0x803:
            type_local = (mpt_type_t)mpt_command_traits();
            break;
          default:
            if ((type < 0x100) || (0x7ff < type)) {
              group = (generic_traits_chunk *)(type - 0x900);
              for (it = (mpt_named_traits *)generic_types; it != (mpt_named_traits *)0x0;
                  it = (mpt_named_traits *)it[10].traits) {
                if (group < (generic_traits_chunk *)(ulong)*(byte *)&it[10].name) {
                  return (&it->traits)[(long)group];
                }
                group = (generic_traits_chunk *)((long)group[-1].traits + 0xe2);
              }
              type_local = 0;
            }
            else {
              pmVar2 = mpt_metatype_traits(type);
              if (pmVar2 == (mpt_named_traits *)0x0) {
                local_68 = (mpt_type_traits *)0x0;
              }
              else {
                local_68 = pmVar2->traits;
              }
              type_local = (mpt_type_t)local_68;
            }
          }
        }
        else {
          iVar1 = (int)type + -0xc0;
          if (iVar1 < dynamic_pos) {
            type_local = (mpt_type_t)(dynamic_types + iVar1);
          }
          else {
            type_local = 0;
          }
        }
      }
      else {
        pmVar2 = mpt_interface_traits(type);
        if (pmVar2 == (mpt_named_traits *)0x0) {
          local_58 = (mpt_type_traits *)0x0;
        }
        else {
          local_58 = pmVar2->traits;
        }
        type_local = (mpt_type_t)local_58;
      }
    }
    else {
      if (iovec_types == (mpt_type_traits *)0x0) {
        _iovec_init();
      }
      if (iovec_types[type - 0x40].size == 0) {
        local_50 = (mpt_type_traits *)0x0;
      }
      else {
        local_50 = iovec_types + (type - 0x40);
      }
      type_local = (mpt_type_t)local_50;
    }
  }
  else {
    if (scalar_types == (mpt_type_traits *)0x0) {
      _scalar_init();
    }
    if (scalar_types[type - 0x60].size == 0) {
      local_48 = (mpt_type_traits *)0x0;
    }
    else {
      local_48 = scalar_types + (type - 0x60);
    }
    type_local = (mpt_type_t)local_48;
  }
  return (mpt_type_traits *)type_local;
}

Assistant:

extern const MPT_STRUCT(type_traits) *mpt_type_traits(MPT_TYPE(type) type)
{
	const struct generic_traits_chunk *group;
	
	/* bad type value */
	if (!type) {
		return 0;
	}
	/* builtin scalar types */
	if (type < MPT_ENUM(_TypeCoreSize)) {
		if (!core_types) {
			_core_init();
		}
		return core_types[type].size ? &core_types[type] : 0;
	}
	/* generic/typed vector */
	if (MPT_type_isScalar(type)) {
		if (!scalar_types) {
			_scalar_init();
		}
		type -= MPT_ENUM(_TypeScalarBase);
		return scalar_types[type].size ? &scalar_types[type] : 0;
	}
	/* generic/typed vector */
	if (MPT_type_isVector(type)) {
		if (!iovec_types) {
			_iovec_init();
		}
		type -= MPT_ENUM(_TypeVectorBase);
		return iovec_types[type].size ? &iovec_types[type] : 0;
	}
	/* interface type */
	if (MPT_type_isInterface(type)) {
		const MPT_STRUCT(named_traits) *it = mpt_interface_traits(type);
		return it ? it->traits : 0;
	}
	
	if (MPT_type_isDynamic(type)) {
		int pos = type - MPT_ENUM(_TypeDynamicBase);
		if (pos >= dynamic_pos) {
			return 0;
		}
		return dynamic_types + pos;
	}
	
	switch (type) {
		case MPT_ENUM(TypeIdentifier):
			return mpt_identifier_traits();
		case MPT_ENUM(TypeArray):
			return mpt_array_traits();
		case MPT_ENUM(TypeMetaRef):
			return mpt_meta_reference_traits();
		case MPT_ENUM(TypeCommand):
			return mpt_command_traits();
		default:;
	}
	
	if (MPT_type_isMetaPtr(type)) {
		const MPT_STRUCT(named_traits) *it = mpt_metatype_traits(type);
		return it ? it->traits : 0;
	}
	
	type -= MPT_ENUM(_TypeValueAdd);
	group = generic_types;
	while (group) {
		if (type < group->used) {
			return group->traits[type];
		}
		type -= MPT_arrsize(group->traits);
		group = group->next;
	}
	
	return 0;
}